

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

Variable * __thiscall soul::ModuleCloner::cloneVariable(ModuleCloner *this,Variable *old)

{
  Module *pMVar1;
  string *psVar2;
  mapped_type *pmVar3;
  Variable *pVVar4;
  Expression *pEVar5;
  string_view newString;
  Variable *local_40 [2];
  StructurePtr local_30;
  Identifier local_28;
  
  local_40[0] = old;
  pmVar3 = std::__detail::
           _Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->variableMappings,(key_type *)local_40);
  if (pmVar3->object == (Variable *)0x0) {
    pMVar1 = this->newModule;
    cloneType((Type *)local_40,this->structMappings,&old->type);
    psVar2 = (old->name).name;
    if (psVar2 == (string *)0x0) {
      local_28.name = (string *)0x0;
    }
    else {
      newString._M_str = (psVar2->_M_dataplus)._M_p;
      newString._M_len = psVar2->_M_string_length;
      local_28 = Identifier::Pool::get(&this->newModule->allocator->identifiers,newString);
    }
    pVVar4 = PoolAllocator::
             allocate<soul::heart::Variable,soul::CodeLocation_const&,soul::Type,soul::Identifier,soul::heart::Variable::Role_const&>
                       (&pMVar1->allocator->pool,&(old->super_Expression).super_Object.location,
                        (Type *)local_40,&local_28,&old->role);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_30.object);
    pVVar4->externalHandle = old->externalHandle;
    pEVar5 = (old->initialValue).object;
    if (pEVar5 != (Expression *)0x0) {
      pEVar5 = cloneExpression(this,pEVar5);
      (pVVar4->initialValue).object = pEVar5;
    }
    Annotation::operator=(&pVVar4->annotation,&old->annotation);
    pmVar3->object = pVVar4;
    return pVVar4;
  }
  throwInternalCompilerError("mapping == nullptr","cloneVariable",0xf4);
}

Assistant:

heart::Variable& cloneVariable (const heart::Variable& old)
    {
        auto& mapping = variableMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        auto& v = newModule.allocate<heart::Variable> (old.location, cloneType (old.type),
                                                       newModule.allocator.get (old.name),
                                                       old.role);
        v.externalHandle = old.externalHandle;

        if (old.initialValue != nullptr)
            v.initialValue = cloneExpression (*old.initialValue);

        v.annotation = old.annotation;
        mapping = v;
        return v;
    }